

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O3

void PrintFunction(Proto *f,int full)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Instruction *pIVar6;
  LocVar *pLVar7;
  Upvaldesc *pUVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  TString *pTVar13;
  char *pcVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  Proto *f_00;
  char *pcVar19;
  char *pcVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  
  pTVar13 = (TString *)"=?";
  if (f->source != (TString *)0x0) {
    pTVar13 = f->source + 1;
  }
  cVar1 = *(char *)&pTVar13->next;
  if (cVar1 == '\x1b') {
    pcVar14 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar14 = (char *)((long)&pTVar13->next + 1);
  }
  else {
    pcVar14 = "(string)";
  }
  uVar3 = f->sizep;
  pcVar17 = "function";
  if (f->linedefined == 0) {
    pcVar17 = "main";
  }
  pcVar16 = "s";
  pcVar19 = "s";
  if (f->sizecode == 1) {
    pcVar19 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar17,pcVar14,(ulong)(uint)f->linedefined,
         (ulong)(uint)f->lastlinedefined,(ulong)(uint)f->sizecode,pcVar19,f);
  pcVar14 = "+";
  if (f->is_vararg == '\0') {
    pcVar14 = "";
  }
  pcVar17 = "s";
  if (f->numparams == 1) {
    pcVar17 = "";
  }
  pcVar19 = "s";
  if (f->maxstacksize == 1) {
    pcVar19 = "";
  }
  pcVar20 = "s";
  if (f->sizeupvalues == 1) {
    pcVar20 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)f->numparams,pcVar14,pcVar17,
         (ulong)f->maxstacksize,pcVar19,(ulong)(uint)f->sizeupvalues,pcVar20);
  pcVar14 = "s";
  if (f->sizelocvars == 1) {
    pcVar14 = "";
  }
  pcVar17 = "s";
  if (f->sizek == 1) {
    pcVar17 = "";
  }
  if (f->sizep == 1) {
    pcVar16 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)f->sizelocvars,pcVar14,
         (ulong)(uint)f->sizek,pcVar17,(ulong)(uint)f->sizep,pcVar16,pcVar20);
  iVar4 = f->sizecode;
  if (0 < iVar4) {
    pIVar6 = f->code;
    iVar15 = 0;
    do {
      uVar5 = pIVar6[iVar15];
      if (f->lineinfo == (int *)0x0) {
        printf("\t%d\t",(ulong)(iVar15 + 1));
LAB_00104b2d:
        printf("[-]\t");
      }
      else {
        uVar12 = f->lineinfo[iVar15];
        printf("\t%d\t",(ulong)(iVar15 + 1));
        if ((int)uVar12 < 1) goto LAB_00104b2d;
        printf("[%d]\t",(ulong)uVar12);
      }
      uVar21 = uVar5 & 0x3f;
      uVar23 = uVar5 >> 6;
      uVar24 = (ulong)uVar23 & 0xff;
      uVar11 = uVar5 >> 0x17;
      uVar12 = uVar5 >> 0xe;
      printf("%-9s\t",luaP_opnames[uVar21]);
      bVar2 = luaP_opmodes[uVar21];
      switch(bVar2 & 3) {
      case 0:
        printf("%d",uVar24);
        if ((bVar2 & 0x30) != 0) {
          uVar10 = ~uVar11 | 0xffffff00;
          if (-1 < (int)uVar5) {
            uVar10 = uVar11;
          }
          printf(" %d",(ulong)uVar10);
        }
        if ((bVar2 & 0xc) != 0) {
          uVar10 = ~uVar12 | 0xffffff00;
          if ((uVar5 >> 0x16 & 1) == 0) {
            uVar10 = uVar12 & 0x1ff;
          }
LAB_00104c6f:
          printf(" %d",(ulong)uVar10);
        }
        break;
      case 1:
        printf("%d",uVar24);
        if ((bVar2 & 0x30) == 0x10) {
          pcVar14 = " %d";
          uVar18 = (ulong)uVar12;
          goto LAB_00104c8b;
        }
        if ((bVar2 & 0x30) == 0x30) {
          uVar10 = ~uVar12;
          goto LAB_00104c6f;
        }
        break;
      case 2:
        printf("%d %d",uVar24,(ulong)(uVar12 - 0x1ffff));
        break;
      case 3:
        pcVar14 = "%d";
        uVar18 = (ulong)~uVar23;
LAB_00104c8b:
        printf(pcVar14,uVar18);
      }
      switch(uVar21) {
      case 1:
        printf("\t; ");
        f_00 = (Proto *)f->k;
        goto LAB_00104eb8;
      case 5:
      case 9:
        lVar22 = *(long *)((long)&f->upvalues->name + (ulong)(uVar11 << 4));
        pcVar14 = "-";
        if (lVar22 != 0) {
          pcVar14 = (char *)(lVar22 + 0x18);
        }
        pcVar17 = "\t; %s";
        goto LAB_00104d98;
      case 6:
        lVar22 = *(long *)((long)&f->upvalues->name + (ulong)(uVar11 << 4));
        pcVar14 = "-";
        if (lVar22 != 0) {
          pcVar14 = (char *)(lVar22 + 0x18);
        }
        printf("\t; %s",pcVar14);
        if ((uVar5 >> 0x16 & 1) != 0) {
          putchar(0x20);
LAB_00104eaf:
          uVar12 = uVar12 & 0xff;
          f_00 = (Proto *)f->k;
          goto LAB_00104eb8;
        }
        break;
      case 7:
      case 0xc:
        if ((uVar5 >> 0x16 & 1) != 0) {
          printf("\t; ");
          goto LAB_00104eaf;
        }
        break;
      case 8:
        lVar22 = *(long *)((long)&f->upvalues->name + (ulong)(uint)((int)uVar24 << 4));
        pcVar14 = "-";
        if (lVar22 != 0) {
          pcVar14 = (char *)(lVar22 + 0x18);
        }
        printf("\t; %s",pcVar14);
        if ((int)uVar5 < 0) {
          putchar(0x20);
          PrintConstant((Proto *)f->k,uVar11 & 0xff);
        }
        if ((uVar5 >> 0x16 & 1) != 0) {
          putchar(0x20);
LAB_00104e5d:
          PrintConstant((Proto *)f->k,uVar12 & 0xff);
        }
        goto LAB_00104ec2;
      case 10:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x1f:
      case 0x20:
      case 0x21:
        if ((uVar5 & 0x80400000) == 0) break;
        printf("\t; ");
        if ((int)uVar5 < 0) {
          PrintConstant((Proto *)f->k,uVar11 & 0xff);
        }
        else {
          putchar(0x2d);
        }
        putchar(0x20);
        if ((uVar5 >> 0x16 & 1) != 0) goto LAB_00104e5d;
        putchar(0x2d);
        goto LAB_00104ec2;
      case 0x1e:
      case 0x27:
      case 0x28:
      case 0x2a:
        printf("\t; to %d",(ulong)(iVar15 + (uVar12 - 0x1ffff) + 2));
        goto LAB_00104ec2;
      case 0x2b:
        if ((uVar12 & 0x1ff) != 0) {
          printf("\t; %d");
          break;
        }
        printf("\t; %d",(ulong)pIVar6[iVar15 + 1]);
        iVar15 = iVar15 + 1;
        goto LAB_00104ec2;
      case 0x2c:
        pcVar14 = (char *)f->p[uVar12];
        pcVar17 = "\t; %p";
LAB_00104d98:
        printf(pcVar17,pcVar14);
        break;
      case 0x2e:
        printf("\t; ");
        f_00 = (Proto *)f->k;
        uVar12 = uVar23;
LAB_00104eb8:
        PrintConstant(f_00,uVar12);
      }
LAB_00104ec2:
      putchar(10);
      iVar15 = iVar15 + 1;
    } while (iVar15 < iVar4);
  }
  if (full != 0) {
    uVar5 = f->sizek;
    printf("constants (%d) for %p:\n",(ulong)uVar5,f);
    if (0 < (int)uVar5) {
      uVar12 = 0;
      do {
        uVar11 = uVar12 + 1;
        printf("\t%d\t",(ulong)uVar11);
        PrintConstant((Proto *)f->k,uVar12);
        putchar(10);
        uVar12 = uVar11;
      } while (uVar5 != uVar11);
    }
    uVar5 = f->sizelocvars;
    printf("locals (%d) for %p:\n",(ulong)uVar5,f);
    if (0 < (long)(int)uVar5) {
      lVar22 = 0xc;
      uVar24 = 0;
      do {
        pLVar7 = f->locvars;
        printf("\t%d\t%s\t%d\t%d\n",uVar24 & 0xffffffff,
               *(long *)((long)pLVar7 + lVar22 + -0xc) + 0x18,
               (ulong)(*(int *)((long)pLVar7 + lVar22 + -4) + 1),
               (ulong)(*(int *)((long)&pLVar7->varname + lVar22) + 1));
        uVar24 = uVar24 + 1;
        lVar22 = lVar22 + 0x10;
      } while ((long)(int)uVar5 != uVar24);
    }
    uVar5 = f->sizeupvalues;
    printf("upvalues (%d) for %p:\n",(ulong)uVar5,f);
    if (0 < (long)(int)uVar5) {
      lVar22 = 9;
      uVar24 = 0;
      do {
        pUVar8 = f->upvalues;
        lVar9 = *(long *)((long)pUVar8 + lVar22 + -9);
        pcVar14 = (char *)(lVar9 + 0x18);
        if (lVar9 == 0) {
          pcVar14 = "-";
        }
        printf("\t%d\t%s\t%d\t%d\n",uVar24 & 0xffffffff,pcVar14,
               (ulong)*(byte *)((long)pUVar8 + lVar22 + -1),
               (ulong)*(byte *)((long)&pUVar8->name + lVar22));
        uVar24 = uVar24 + 1;
        lVar22 = lVar22 + 0x10;
      } while ((long)(int)uVar5 != uVar24);
    }
  }
  if (0 < (int)uVar3) {
    uVar24 = 0;
    do {
      PrintFunction(f->p[uVar24],full);
      uVar24 = uVar24 + 1;
    } while (uVar3 != uVar24);
  }
  return;
}

Assistant:

static void PrintFunction(const Proto *f, int full) {
    int i, n = f->sizep;
    PrintHeader(f);
    PrintCode(f);
    if (full) PrintDebug(f);
    for (i = 0; i < n; i++) PrintFunction(f->p[i], full);
}